

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sds.c
# Opt level: O0

int sdscmp(sds s1,sds s2)

{
  size_t sVar1;
  size_t sVar2;
  size_t local_48;
  int cmp;
  size_t minlen;
  size_t l2;
  size_t l1;
  sds s2_local;
  sds s1_local;
  
  sVar1 = sdslen(s1);
  sVar2 = sdslen(s2);
  local_48 = sVar2;
  if (sVar1 < sVar2) {
    local_48 = sVar1;
  }
  s1_local._4_4_ = memcmp(s1,s2,local_48);
  if (s1_local._4_4_ == 0) {
    s1_local._4_4_ = (int)sVar1 - (int)sVar2;
  }
  return s1_local._4_4_;
}

Assistant:

int sdscmp(const sds s1, const sds s2) {
    size_t l1, l2, minlen;
    int cmp;

    l1 = sdslen(s1);
    l2 = sdslen(s2);
    minlen = (l1 < l2) ? l1 : l2;
    cmp = memcmp(s1,s2,minlen);
    if (cmp == 0) return l1-l2;
    return cmp;
}